

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O2

sunrealtype N_VMinQuotient_SensWrapper(N_Vector num,N_Vector denom)

{
  long lVar1;
  sunrealtype sVar2;
  sunrealtype sVar3;
  
  sVar2 = N_VMinQuotient((N_Vector)**num->content,(N_Vector)**denom->content);
  for (lVar1 = 1; lVar1 < (int)*(long *)((long)num->content + 8); lVar1 = lVar1 + 1) {
    sVar3 = N_VMinQuotient(*(N_Vector *)(*num->content + lVar1 * 8),
                           *(N_Vector *)(*denom->content + lVar1 * 8));
    if (sVar2 <= sVar3) {
      sVar3 = sVar2;
    }
    sVar2 = sVar3;
  }
  return sVar2;
}

Assistant:

sunrealtype N_VMinQuotient_SensWrapper(N_Vector num, N_Vector denom)
{
  int i;
  sunrealtype min, tmp;

  min = N_VMinQuotient(NV_VEC_SW(num, 0), NV_VEC_SW(denom, 0));

  for (i = 1; i < NV_NVECS_SW(num); i++)
  {
    tmp = N_VMinQuotient(NV_VEC_SW(num, i), NV_VEC_SW(denom, i));
    if (tmp < min) { min = tmp; }
  }

  return (min);
}